

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_interaction.cpp
# Opt level: O0

void P_PoisonMobj(AActor *target,AActor *inflictor,AActor *source,int damage,int duration,int period
                 ,FName *type)

{
  uint uVar1;
  TFlags<ActorFlag6,_unsigned_int> local_40;
  TFlags<ActorFlag6,_unsigned_int> local_3c;
  TFlags<ActorFlag3,_unsigned_int> local_38;
  TFlags<ActorFlag2,_unsigned_int> local_34;
  TFlags<ActorFlag6,_unsigned_int> local_30;
  int local_2c;
  int local_28;
  int period_local;
  int duration_local;
  int damage_local;
  AActor *source_local;
  AActor *inflictor_local;
  AActor *target_local;
  
  local_2c = period;
  local_28 = duration;
  period_local = damage;
  _duration_local = source;
  source_local = inflictor;
  inflictor_local = target;
  TFlags<ActorFlag6,_unsigned_int>::operator&
            (&local_30,
             (int)inflictor + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
  uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_30);
  if (uVar1 == 0) {
    TFlags<ActorFlag2,_unsigned_int>::operator&
              (&local_34,(int)inflictor_local + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
    uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_34);
    if (uVar1 != 0) {
      if (inflictor_local->player != (player_t *)0x0) {
        return;
      }
      TFlags<ActorFlag3,_unsigned_int>::operator&
                (&local_38,
                 (int)source_local +
                 (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
      uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_38);
      if (uVar1 == 0) {
        return;
      }
    }
  }
  TObjPtr<AActor>::operator=(&inflictor_local->Poisoner,_duration_local);
  FNameNoInit::operator=(&inflictor_local->PoisonDamageTypeReceived,type);
  inflictor_local->PoisonPeriodReceived = local_2c;
  TFlags<ActorFlag6,_unsigned_int>::operator&
            (&local_3c,
             (int)source_local + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
  uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_3c);
  if (uVar1 == 0) {
    inflictor_local->PoisonDamageReceived = period_local;
  }
  else {
    inflictor_local->PoisonDamageReceived = period_local + inflictor_local->PoisonDamageReceived;
  }
  TFlags<ActorFlag6,_unsigned_int>::operator&
            (&local_40,
             (int)source_local + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
  uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_40);
  if (uVar1 == 0) {
    inflictor_local->PoisonDurationReceived = local_28;
  }
  else {
    inflictor_local->PoisonDurationReceived = local_28 + inflictor_local->PoisonDurationReceived;
  }
  return;
}

Assistant:

void P_PoisonMobj (AActor *target, AActor *inflictor, AActor *source, int damage, int duration, int period, FName type)
{
	// Check for invulnerability.
	if (!(inflictor->flags6 & MF6_POISONALWAYS))
	{
		if (target->flags2 & MF2_INVULNERABLE)
		{ // actor is invulnerable
			if (target->player == NULL)
			{
				if (!(inflictor->flags3 & MF3_FOILINVUL))
				{
					return;
				}
			}
			else
			{
				return;
			}
		}
	}

	target->Poisoner = source;
	target->PoisonDamageTypeReceived = type;
	target->PoisonPeriodReceived = period;

	if (inflictor->flags6 & MF6_ADDITIVEPOISONDAMAGE)
	{
		target->PoisonDamageReceived += damage;
	}
	else
	{
		target->PoisonDamageReceived = damage;
	}

	if (inflictor->flags6 & MF6_ADDITIVEPOISONDURATION)
	{
		target->PoisonDurationReceived += duration;
	}
	else
	{
		target->PoisonDurationReceived = duration;
	}

}